

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

bool __thiscall
chrono::ChSystem::DoStaticNonlinearRheonomic
          (ChSystem *this,int nsteps,bool verbose,
          shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback> *mcallback)

{
  ChVisualSystem *pCVar1;
  int max_iters;
  int max_iters_00;
  ChStaticNonLinearRheonomicAnalysis manalysis;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  ChStaticNonLinearRheonomicAnalysis local_98;
  
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  this->applied_forces_current = false;
  this->setupcount = 0;
  this->solvecount = 0;
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  Update(this,true);
  max_iters = GetSolverMaxIterations(this);
  max_iters_00 = 300;
  if (300 < max_iters) {
    max_iters_00 = max_iters;
  }
  SetSolverMaxIterations(this,max_iters_00);
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3a])
            (this,(this->descriptor).
                  super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  ChStaticNonLinearRheonomicAnalysis::ChStaticNonLinearRheonomicAnalysis
            (&local_98,&this->super_ChIntegrableIIorder);
  ChStaticNonLinearRheonomicAnalysis::SetMaxIterations(&local_98,nsteps);
  local_98.callback_iteration_begin.
  super___shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (mcallback->
            super___shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_a0._M_pi =
       (mcallback->
       super___shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
    }
  }
  local_98.m_verbose = verbose;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_98.callback_iteration_begin.
              super___shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_a0);
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  ChStaticNonLinearRheonomicAnalysis::StaticAnalysis(&local_98);
  SetSolverMaxIterations(this,max_iters);
  pCVar1 = this->visual_system;
  if (pCVar1 != (ChVisualSystem *)0x0) {
    (**(code **)(*(long *)pCVar1 + 0x58))(pCVar1,this);
  }
  ChStaticNonLinearRheonomicAnalysis::~ChStaticNonLinearRheonomicAnalysis(&local_98);
  return true;
}

Assistant:

bool ChSystem::DoStaticNonlinearRheonomic(int nsteps, bool verbose, std::shared_ptr<ChStaticNonLinearRheonomicAnalysis::IterationCallback> mcallback) {
    if (!is_initialized)
        SetupInitial();

    applied_forces_current = false;

    solvecount = 0;
    setupcount = 0;

    Setup();
    Update();

    int old_maxsteps = GetSolverMaxIterations();
    SetSolverMaxIterations(std::max(old_maxsteps, 300));

    // Prepare lists of variables and constraints.
    DescriptorPrepareInject(*descriptor);

    ChStaticNonLinearRheonomicAnalysis manalysis(*this);
    manalysis.SetMaxIterations(nsteps);
    manalysis.SetVerbose(verbose);
    manalysis.SetCallbackIterationBegin(mcallback);

    // Perform analysis
    manalysis.StaticAnalysis();

    SetSolverMaxIterations(old_maxsteps);

    // Update any attached visualization system
    if (visual_system)
        visual_system->OnUpdate(this);

    return true;
}